

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O3

int qc_file_close(QcFile *file)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  __off_t _Var4;
  int __whence;
  size_t __nbytes;
  size_t __n;
  void *in_RSI;
  stat sStack_c8;
  
  if (file != (QcFile *)0x0) {
    iVar1 = close(file->filedes);
    if (iVar1 == 0) {
      free(file);
      iVar1 = 0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x52,"file close failed");
      iVar1 = -1;
    }
    return iVar1;
  }
  qc_file_close_cold_1();
  if (file != (QcFile *)0x0) {
    sVar3 = read(file->filedes,in_RSI,__nbytes);
    return (int)sVar3;
  }
  qc_file_read_cold_1();
  if (file != (QcFile *)0x0) {
    sVar3 = write(file->filedes,in_RSI,__n);
    return (int)sVar3;
  }
  qc_file_write_cold_1();
  if (file != (QcFile *)0x0) {
    iVar1 = fsync(file->filedes);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x83,"file sync failed");
      iVar1 = -1;
    }
    return iVar1;
  }
  qc_file_sync_cold_1();
  if (file != (QcFile *)0x0) {
    _Var4 = lseek(file->filedes,(__off_t)in_RSI,__whence);
    if (_Var4 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x94,"file seek failed");
      _Var4 = -1;
    }
    return (int)_Var4;
  }
  qc_file_seek_cold_1();
  if (file != (QcFile *)0x0) {
    _Var4 = lseek(file->filedes,0,1);
    if (_Var4 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0xa5,"file tell failed");
      _Var4 = -1;
    }
    return (int)_Var4;
  }
  qc_file_tell_cold_1();
  if (file != (QcFile *)0x0) {
    sStack_c8.__unused[2] = 0x106eb5;
    iVar1 = access((char *)file,0);
    return -(uint)(iVar1 != 0);
  }
  sStack_c8.__unused[2] = (long)qc_file_size;
  qc_file_exist_cold_1();
  iVar2 = stat((char *)file,&sStack_c8);
  iVar1 = -1;
  if (-1 < iVar2) {
    iVar1 = (int)sStack_c8.st_size;
  }
  return iVar1;
}

Assistant:

int qc_file_close(QcFile *file)
{
    qc_assert(file);

    if(0 != close(file->filedes))
    {
        qc_error("file close failed");
        return -1;
    }

    qc_free(file);
    return 0;
}